

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O3

Status __thiscall
google::protobuf::anon_unknown_21::FillDefaults
          (anon_unknown_21 *this,Edition edition,Message *fixed,Message *overridable)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  pointer pFVar6;
  bool bVar7;
  FieldOptions_FeatureSupport *p;
  Descriptor *pDVar8;
  undefined1 *puVar9;
  Rep *pRVar10;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *this_00;
  ulong uVar11;
  Status extraout_RAX;
  Nonnull<const_char_*> failure_msg;
  pointer pFVar12;
  FieldDescriptor *pFVar13;
  RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault> __first;
  ulong uVar14;
  ulong uVar15;
  _Alloc_hider _Var16;
  AlphaNum *in_R9;
  long lVar17;
  size_t *psVar18;
  FieldDescriptor *this_01;
  __normal_iterator<google::protobuf::FieldOptions_EditionDefault_*,_std::vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>_>
  __i;
  FieldOptions *pFVar19;
  long lVar20;
  pointer pFVar21;
  Metadata MVar22;
  string_view input;
  string_view message;
  string_view message_00;
  vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
  defaults;
  EditionDefault edition_lookup;
  string local_1a0;
  FieldDescriptor *local_180;
  vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
  local_178;
  FieldDescriptor *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  ulong local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  StringifySink local_138;
  LogMessage local_118 [3];
  FieldOptions_EditionDefault local_e8;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  local_180 = (FieldDescriptor *)fixed;
  MVar22 = Message::GetMetadata(fixed);
  pDVar8 = MVar22.descriptor;
  MVar22 = Message::GetMetadata(overridable);
  if (pDVar8 != MVar22.descriptor) {
    _GLOBAL__N_1::FillDefaults((_GLOBAL__N_1 *)local_118);
LAB_0024b95e:
    internal::protobuf_assumption_failed
              ("!value || _impl_.feature_support_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x49b9);
  }
  FieldOptions_EditionDefault::FieldOptions_EditionDefault(&local_e8,(Arena *)0x0);
  bVar7 = internal::ValidateEnum(edition,(uint32_t *)Edition_internal_data_);
  if (!bVar7) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::Edition_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                  ,0x46f6,
                  "void google::protobuf::FieldOptions_EditionDefault::_internal_set_edition(::google::protobuf::Edition)"
                 );
  }
  local_e8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_e8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  local_e8.field_0._impl_.edition_ = edition;
  if (0 < pDVar8->field_count_) {
    lVar17 = 0;
    do {
      pFVar13 = pDVar8->fields_;
      pFVar19 = pFVar13[lVar17].options_;
      uVar3 = (pFVar19->field_0)._impl_._has_bits_.has_bits_[0];
      puVar9 = (undefined1 *)(pFVar19->field_0)._impl_.feature_support_;
      if (((FieldOptions_FeatureSupport *)puVar9 == (FieldOptions_FeatureSupport *)0x0 &
          (byte)uVar3 >> 1) == 1) goto LAB_0024b95e;
      this_01 = (FieldDescriptor *)overridable;
      if ((uVar3 & 2) != 0) {
        if ((FieldOptions_FeatureSupport *)puVar9 == (FieldOptions_FeatureSupport *)0x0) {
          puVar9 = _FieldOptions_FeatureSupport_default_instance_;
        }
        if ((((((undefined1  [32])((FieldOptions_FeatureSupport *)puVar9)->field_0 &
               (undefined1  [32])0x2) == (undefined1  [32])0x0) ||
             (this_01 = local_180,
             (((FieldOptions_FeatureSupport *)puVar9)->field_0)._impl_.edition_introduced_ <=
             (int)edition)) &&
            (this_01 = (FieldDescriptor *)overridable,
            ((undefined1  [32])((FieldOptions_FeatureSupport *)puVar9)->field_0 &
            (undefined1  [32])0x8) != (undefined1  [32])0x0)) &&
           ((((FieldOptions_FeatureSupport *)puVar9)->field_0)._impl_.edition_removed_ <=
            (int)edition)) {
          this_01 = local_180;
        }
      }
      MVar22 = Message::GetMetadata((Message *)this_01);
      pFVar13 = pFVar13 + lVar17;
      Reflection::ClearField(MVar22.reflection,(Message *)this_01,pFVar13);
      bVar2 = pFVar13->field_0x1;
      bVar7 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 != bVar7) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar7,0xbf < bVar2,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_118,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,failure_msg);
LAB_0024b944:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_118);
      }
      if ((bVar2 & 0x20) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_118,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
                   ,0x136,"!field.is_repeated()");
        goto LAB_0024b944;
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar13->type_ * 4) == 10) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_118,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
                   ,0x137,"field.cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE");
        goto LAB_0024b944;
      }
      pFVar19 = pFVar13->options_;
      __first.it_ = (void **)&(pFVar19->field_0)._impl_.edition_defaults_;
      local_160 = this_01;
      if ((*(byte *)((long)&pFVar19->field_0 + 0x30) & 1) == 0) {
        this_00 = &(pFVar19->field_0)._impl_.edition_defaults_;
      }
      else {
        pRVar10 = internal::RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)__first.it_);
        __first.it_ = pRVar10->elements;
        pFVar19 = pFVar13->options_;
        this_00 = &(pFVar19->field_0)._impl_.edition_defaults_;
        if ((*(byte *)((long)&pFVar19->field_0 + 0x30) & 1) != 0) {
          pRVar10 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
          this_00 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                    pRVar10->elements;
        }
      }
      std::
      vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>
      ::
      vector<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::FieldOptions_EditionDefault_const>,void>
                ((vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>
                  *)&local_178,__first,
                 (RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault>)
                 (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                 *(int *)((long)&pFVar19->field_0 + 0x38)),(allocator_type *)local_118);
      pFVar6 = local_178.
               super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pFVar12 = local_178.
                super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_178.
          super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_178.
          super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar20 = (long)local_178.
                       super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_178.
                       super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (lVar20 >> 3) * -0x3333333333333333;
        lVar5 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldOptions_EditionDefault*,std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0>>
                  (local_178.
                   super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_178.
                   super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar20 < 0x281) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldOptions_EditionDefault*,std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0>>
                    (pFVar12,pFVar6);
        }
        else {
          pFVar21 = pFVar12 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldOptions_EditionDefault*,std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0>>
                    (pFVar12,pFVar21);
          for (; pFVar21 != pFVar6; pFVar21 = pFVar21 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldOptions_EditionDefault*,std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0>>
                      (pFVar21);
          }
        }
      }
      if ((long)local_178.
                super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_178.
                super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                ._M_impl.super__Vector_impl_data._M_start < 1) {
LAB_0024b6c8:
        pcVar4 = (pFVar13->all_names_).payload_;
        uVar11 = (ulong)*(ushort *)(pcVar4 + 2);
        local_118[0].errno_saver_.saved_errno_ = 0x23;
        local_118[0]._4_4_ = 0;
        local_118[0].data_._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
              )(__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                )0x439807;
        paVar1 = &local_138.buffer_.field_2;
        local_138.buffer_.field_2._M_allocated_capacity = 0;
        local_138.buffer_.field_2._8_8_ = 0;
        local_138.buffer_._M_string_length = 0;
        local_138.buffer_._M_dataplus._M_p = (pointer)paVar1;
        AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_138,edition);
        local_c0.piece_._M_str = pcVar4 + ~uVar11;
        local_60.piece_._M_len = local_138.buffer_._M_string_length;
        local_60.piece_._M_str = local_138.buffer_._M_dataplus._M_p;
        local_90.piece_._M_len = 0x12;
        local_90.piece_._M_str = " in feature field ";
        local_c0.piece_._M_len = uVar11;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_1a0,(lts_20250127 *)local_118,&local_60,&local_90,&local_c0,in_R9);
        message._M_str = (char *)local_1a0._M_string_length;
        message._M_len = (size_t)this;
        absl::lts_20250127::FailedPreconditionError(message);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        local_148._M_allocated_capacity = local_138.buffer_.field_2._M_allocated_capacity;
        _Var16._M_p = local_138.buffer_._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.buffer_._M_dataplus._M_p != paVar1) {
LAB_0024b89c:
          operator_delete(_Var16._M_p,local_148._M_allocated_capacity + 1);
        }
LAB_0024b8a4:
        std::
        vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
        ::~vector(&local_178);
        goto LAB_0024b8ae;
      }
      pFVar12 = local_178.
                super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = ((ulong)((long)local_178.
                              super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_178.
                             super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x3333333333333333;
      do {
        uVar14 = uVar11 >> 1;
        uVar15 = uVar14;
        if (pFVar12[uVar14].field_0._impl_.edition_ <= local_e8.field_0._impl_.edition_) {
          uVar15 = ~uVar14 + uVar11;
          pFVar12 = pFVar12 + uVar14 + 1;
        }
        uVar11 = uVar15;
      } while (0 < (long)uVar15);
      if (pFVar12 ==
          local_178.
          super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
          ._M_impl.super__Vector_impl_data._M_start) goto LAB_0024b6c8;
      psVar18 = (size_t *)
                ((ulong)pFVar12[-1].field_0._impl_.value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      input._M_str = (char *)pFVar13;
      input._M_len = *psVar18;
      bVar7 = TextFormat::ParseFieldValueFromString
                        ((TextFormat *)psVar18[1],input,local_160,(Message *)(uVar14 * 5));
      if (!bVar7) {
        pcVar4 = (pFVar13->all_names_).payload_;
        uVar11 = (ulong)*(ushort *)(pcVar4 + 2);
        local_158 = &local_148;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,*psVar18,psVar18[1] + *psVar18);
        local_60.piece_._M_str = pcVar4 + ~uVar11;
        local_118[0].errno_saver_.saved_errno_ = 0x34;
        local_118[0]._4_4_ = 0;
        local_118[0].data_._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
              )(__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                )0x43db6b;
        local_90.piece_._M_len = 0x13;
        local_90.piece_._M_str = ". Could not parse: ";
        local_c0.piece_._M_len = local_150;
        local_c0.piece_._M_str = (char *)local_158;
        local_60.piece_._M_len = uVar11;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_1a0,(lts_20250127 *)local_118,&local_60,&local_90,&local_c0,in_R9);
        message_00._M_str = (char *)local_1a0._M_string_length;
        message_00._M_len = (size_t)this;
        absl::lts_20250127::FailedPreconditionError(message_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        _Var16._M_p = (pointer)local_158;
        if (local_158 != &local_148) goto LAB_0024b89c;
        goto LAB_0024b8a4;
      }
      std::
      vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
      ::~vector(&local_178);
      lVar17 = lVar17 + 1;
    } while (lVar17 < pDVar8->field_count_);
  }
  *(undefined8 *)this = 1;
LAB_0024b8ae:
  FieldOptions_EditionDefault::~FieldOptions_EditionDefault(&local_e8);
  return (Status)extraout_RAX.rep_;
}

Assistant:

absl::Status FillDefaults(Edition edition, Message& fixed,
                          Message& overridable) {
  const Descriptor& descriptor = *fixed.GetDescriptor();
  ABSL_CHECK(&descriptor == overridable.GetDescriptor());

  auto comparator = [](const FieldOptions::EditionDefault& a,
                       const FieldOptions::EditionDefault& b) {
    return a.edition() < b.edition();
  };
  FieldOptions::EditionDefault edition_lookup;
  edition_lookup.set_edition(edition);

  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);
    Message* msg = &overridable;
    if (field.options().has_feature_support()) {
      if ((field.options().feature_support().has_edition_introduced() &&
           edition < field.options().feature_support().edition_introduced()) ||
          (field.options().feature_support().has_edition_removed() &&
           edition >= field.options().feature_support().edition_removed())) {
        msg = &fixed;
      }
    }

    msg->GetReflection()->ClearField(msg, &field);
    ABSL_CHECK(!field.is_repeated());
    ABSL_CHECK(field.cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE);

    std::vector<FieldOptions::EditionDefault> defaults{
        field.options().edition_defaults().begin(),
        field.options().edition_defaults().end()};
    absl::c_sort(defaults, comparator);
    auto first_nonmatch =
        absl::c_upper_bound(defaults, edition_lookup, comparator);
    if (first_nonmatch == defaults.begin()) {
      return Error("No valid default found for edition ", edition,
                   " in feature field ", field.full_name());
    }

    const std::string& def = std::prev(first_nonmatch)->value();
    if (!TextFormat::ParseFieldValueFromString(def, &field, msg)) {
      return Error("Parsing error in edition_defaults for feature field ",
                   field.full_name(), ". Could not parse: ", def);
    }
  }

  return absl::OkStatus();
}